

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::WriteWholeFile(string *filepath,uchar *contents,size_t content_bytes,string *err)

{
  char *pcVar1;
  ulong uVar2;
  string local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [36];
  undefined4 local_274;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  long local_230;
  ofstream f;
  string *err_local;
  size_t content_bytes_local;
  uchar *contents_local;
  string *filepath_local;
  
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  ::std::ofstream::ofstream(&local_230,pcVar1,_S_bin);
  uVar2 = ::std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if ((uVar2 & 1) == 0) {
    ::std::ostream::write((char *)&local_230,(long)contents);
    uVar2 = ::std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
    if ((uVar2 & 1) == 0) {
      filepath_local._7_1_ = true;
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+((char *)local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "File write error: ");
        ::std::operator+(local_298,(char *)local_2b8);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_298);
        ::std::__cxx11::string::~string((string *)local_298);
        ::std::__cxx11::string::~string(local_2b8);
      }
      filepath_local._7_1_ = false;
    }
  }
  else {
    if (err != (string *)0x0) {
      ::std::operator+((char *)local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "File open error for writing : ");
      ::std::operator+(local_250,(char *)local_270);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_250);
      ::std::__cxx11::string::~string((string *)local_250);
      ::std::__cxx11::string::~string(local_270);
    }
    filepath_local._7_1_ = false;
  }
  local_274 = 1;
  ::std::ofstream::~ofstream(&local_230);
  return filepath_local._7_1_;
}

Assistant:

bool WriteWholeFile(const std::string &filepath, const unsigned char *contents,
                    size_t content_bytes, std::string *err) {
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor = _wopen(UTF8ToWchar(filepath).c_str(),
                               _O_CREAT | _O_WRONLY | _O_TRUNC | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(
      file_descriptor, std::ios_base::out | std::ios_base::binary);
  std::ostream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  std::ofstream f(UTF8ToWchar(filepath).c_str(), std::ofstream::binary);
#else  // other C++ compiler for win32?
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
#else
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error for writing : " + filepath + "\n";
    }
    return false;
  }

  f.write(reinterpret_cast<const char *>(contents),
          static_cast<std::streamsize>(content_bytes));
  if (!f) {
    if (err) {
      (*err) += "File write error: " + filepath + "\n";
    }
    return false;
  }

  return true;
}